

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O2

void __thiscall flyd::Signal::AddSingal(Signal *this,int signo,SigFunction sighandler)

{
  int iVar1;
  LogStream *this_00;
  SourceFile file;
  undefined1 local_1090 [12];
  sigaction sa;
  undefined1 local_fe8 [8];
  LogStream local_fe0;
  
  local_fe8._0_4_ = signo;
  local_fe0._0_8_ = sighandler;
  std::
  _Hashtable<int,std::pair<int_const,void(*)(int,siginfo_t*,void*)>,std::allocator<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>
            ((_Hashtable<int,std::pair<int_const,void(*)(int,siginfo_t*,void*)>,std::allocator<std::pair<int_const,void(*)(int,siginfo_t*,void*)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&signals_);
  sa.sa_flags = 4;
  sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)sighandler;
  sigemptyset((sigset_t *)&sa.sa_mask);
  iVar1 = sigaction(signo,(sigaction *)&sa,(sigaction *)0x0);
  if (iVar1 < 0) {
    muduo::Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_1090,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/signal/flyd_signal.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1090._0_8_;
    file.size_ = local_1090._8_4_;
    muduo::Logger::Logger((Logger *)local_fe8,file,0x16,ERROR);
    this_00 = muduo::LogStream::operator<<(&local_fe0,signo);
    muduo::LogStream::operator<<(this_00,anon_var_dwarf_12bb4);
    muduo::Logger::~Logger((Logger *)local_fe8);
  }
  return;
}

Assistant:

void flyd::Signal::AddSingal(int signo, SigFunction sighandler)
{
    struct sigaction sa;// 定义一个管理信号的结构体
    signals_.insert({signo, sighandler});
    sa.sa_sigaction = sighandler;
    sa.sa_flags = SA_SIGINFO;//令sa_sigaction指定的信号处理程序生效
    sigemptyset(&sa.sa_mask);
    if( sigaction(signo, &sa, NULL) < 0)
        LOG_ERROR << signo << "信号注册失败\n";
}